

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma2_encoder.c
# Opt level: O1

lzma_ret lzma2_encoder_options_update(lzma_coder_conflict7 *coder,lzma_filter *filter)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  lzma_ret lVar5;
  
  pvVar4 = filter->options;
  lVar5 = LZMA_PROG_ERROR;
  if (((((pvVar4 != (void *)0x0) && (coder->sequence == SEQ_INDICATOR)) &&
       ((uVar1 = *(uint *)((long)pvVar4 + 0x14), (coder->opt_cur).lc != uVar1 ||
        (((coder->opt_cur).lp != *(uint32_t *)((long)pvVar4 + 0x18) ||
         (lVar5 = LZMA_OK, (coder->opt_cur).pb != *(uint32_t *)((long)pvVar4 + 0x1c))))))) &&
      (lVar5 = LZMA_OPTIONS_ERROR, uVar1 < 5)) &&
     ((uVar2 = *(uint *)((long)pvVar4 + 0x18), uVar2 + uVar1 < 5 && uVar2 < 5 &&
      (uVar3 = *(uint *)((long)pvVar4 + 0x1c), uVar3 < 5)))) {
    (coder->opt_cur).lc = uVar1;
    (coder->opt_cur).lp = uVar2;
    (coder->opt_cur).pb = uVar3;
    coder->need_properties = true;
    coder->need_state_reset = true;
    return LZMA_OK;
  }
  return lVar5;
}

Assistant:

static lzma_ret
lzma2_encoder_options_update(lzma_coder *coder, const lzma_filter *filter)
{
	lzma_options_lzma *opt;

	// New options can be set only when there is no incomplete chunk.
	// This is the case at the beginning of the raw stream and right
	// after LZMA_SYNC_FLUSH.
	if (filter->options == NULL || coder->sequence != SEQ_INIT)
		return LZMA_PROG_ERROR;

	// Look if there are new options. At least for now,
	// only lc/lp/pb can be changed.
	opt = filter->options;
	if (coder->opt_cur.lc != opt->lc || coder->opt_cur.lp != opt->lp
			|| coder->opt_cur.pb != opt->pb) {
		// Validate the options.
		if (opt->lc > LZMA_LCLP_MAX || opt->lp > LZMA_LCLP_MAX
				|| opt->lc + opt->lp > LZMA_LCLP_MAX
				|| opt->pb > LZMA_PB_MAX)
			return LZMA_OPTIONS_ERROR;

		// The new options will be used when the encoder starts
		// a new LZMA2 chunk.
		coder->opt_cur.lc = opt->lc;
		coder->opt_cur.lp = opt->lp;
		coder->opt_cur.pb = opt->pb;
		coder->need_properties = true;
		coder->need_state_reset = true;
	}

	return LZMA_OK;
}